

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bstrListAlloc(bstrList *sl,int msz)

{
  size_t nsz;
  bstring *pptStack_28;
  int smsz;
  bstring *l;
  int msz_local;
  bstrList *sl_local;
  
  if (((((sl == (bstrList *)0x0) || (msz < 1)) || (sl->entry == (bstring *)0x0)) ||
      ((sl->qty < 0 || (sl->mlen < 1)))) || (sl->mlen < sl->qty)) {
    sl_local._4_4_ = -1;
  }
  else if (sl->mlen < msz) {
    nsz._4_4_ = snapUpSize(msz);
    if ((ulong)((long)nsz._4_4_ << 3) < (ulong)(long)nsz._4_4_) {
      sl_local._4_4_ = -1;
    }
    else {
      pptStack_28 = (bstring *)realloc(sl->entry,(long)nsz._4_4_ << 3);
      if ((pptStack_28 == (bstring *)0x0) &&
         (pptStack_28 = (bstring *)realloc(sl->entry,(long)msz << 3), nsz._4_4_ = msz,
         pptStack_28 == (bstring *)0x0)) {
        sl_local._4_4_ = -1;
      }
      else {
        sl->mlen = nsz._4_4_;
        sl->entry = pptStack_28;
        sl_local._4_4_ = 0;
      }
    }
  }
  else {
    sl_local._4_4_ = 0;
  }
  return sl_local._4_4_;
}

Assistant:

int bstrListAlloc (struct bstrList * sl, int msz) {
bstring * l;
int smsz;
size_t nsz;
	if (!sl || msz <= 0 || !sl->entry || sl->qty < 0 || sl->mlen <= 0 ||
	    sl->qty > sl->mlen) return BSTR_ERR;
	if (sl->mlen >= msz) return BSTR_OK;
	smsz = snapUpSize (msz);
	nsz = ((size_t) smsz) * sizeof (bstring);
	if (nsz < (size_t) smsz) return BSTR_ERR;
	l = (bstring *) bstr__realloc (sl->entry, nsz);
	if (!l) {
		smsz = msz;
		nsz = ((size_t) smsz) * sizeof (bstring);
		l = (bstring *) bstr__realloc (sl->entry, nsz);
		if (!l) return BSTR_ERR;
	}
	sl->mlen = smsz;
	sl->entry = l;
	return BSTR_OK;
}